

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictVectorizer.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::DictVectorizer::MergeFrom(DictVectorizer *this,DictVectorizer *from)

{
  LogMessage *other;
  Int64Vector *this_00;
  StringVector *this_01;
  undefined1 *puVar1;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/DictVectorizer.pb.cc"
               ,0x135);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if (from->_oneof_case_[0] == 1) {
    this_01 = _internal_mutable_stringtoindex(this);
    if (from->_oneof_case_[0] == 1) {
      puVar1 = (undefined1 *)(from->Map_).stringtoindex_;
    }
    else {
      puVar1 = _StringVector_default_instance_;
    }
    StringVector::MergeFrom(this_01,(StringVector *)puVar1);
  }
  else if (from->_oneof_case_[0] == 2) {
    this_00 = _internal_mutable_int64toindex(this);
    if (from->_oneof_case_[0] == 2) {
      puVar1 = (undefined1 *)(from->Map_).int64toindex_;
    }
    else {
      puVar1 = _Int64Vector_default_instance_;
    }
    Int64Vector::MergeFrom(this_00,(Int64Vector *)puVar1);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void DictVectorizer::MergeFrom(const DictVectorizer& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.DictVectorizer)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.Map_case()) {
    case kStringToIndex: {
      _internal_mutable_stringtoindex()->::CoreML::Specification::StringVector::MergeFrom(from._internal_stringtoindex());
      break;
    }
    case kInt64ToIndex: {
      _internal_mutable_int64toindex()->::CoreML::Specification::Int64Vector::MergeFrom(from._internal_int64toindex());
      break;
    }
    case MAP_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}